

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O2

void __thiscall helics::ValueFederate::~ValueFederate(ValueFederate *this)

{
  ~ValueFederate((ValueFederate *)
                 ((long)&this->_vptr_ValueFederate + (long)this->_vptr_ValueFederate[-3]));
  return;
}

Assistant:

void ValueFederate::loadFederateData()
{
    vfManager = std::make_unique<ValueFederateManager>(coreObject.get(),
                                                       this,
                                                       getID(),
                                                       singleThreadFederate);
    vfManager->useJsonSerialization = useJsonSerialization;
    if (!configFile.empty()) {
        ValueFederate::registerValueInterfaces(configFile);
    }
}